

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,void **vtt,TPZGeoBlend<pzgeom::TPZGeoCube> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  long lVar8;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  iVar1 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1];
  iVar2 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2];
  iVar3 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3];
  iVar4 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4];
  iVar5 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5];
  iVar6 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6];
  iVar7 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0] =
       (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2] = iVar2;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3] = iVar3;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4] = iVar4;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5] = iVar5;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6] = iVar6;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7] = iVar7;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  lVar8 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar8) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar8) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar8) = 0xffffffffffffffff;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x1e0);
  this_00 = (TPZTransform<double> *)&this->field_0x230;
  lVar8 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar8));
    lVar8 = lVar8 + 0x1a0;
  } while (lVar8 != 0x2080);
  t = (TPZTransform<double> *)&cp->field_0x230;
  for (lVar8 = 0; lVar8 != 0x1e0; lVar8 = lVar8 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar8) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar8);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar8) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar8);
    TPZTransform<double>::operator=(this_00,t);
    t = t + 1;
    this_00 = this_00 + 1;
  }
  this->fGeoEl = (TPZGeoEl *)0x0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x3f);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }